

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O2

void ut::are_equal<char,6ul>
               (char (*expected) [6],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,
               LocationInfo *location)

{
  FailedAssertion *this;
  bool bVar1;
  allocator local_39;
  string local_38;
  
  bVar1 = std::operator==(*expected,actual);
  if (bVar1) {
    return;
  }
  this = (FailedAssertion *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&local_38,"Values are not equal!",&local_39);
  FailedAssertion::FailedAssertion(this,&local_38,location);
  __cxa_throw(this,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(const T (&expected)[n], const std::basic_string<T> &actual, const LocationInfo &location)
	{
		if (!(expected == actual))
			throw FailedAssertion("Values are not equal!", location);
	}